

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadColor(ON_BinaryArchive *this,ON_4fColor *color)

{
  bool local_1d;
  float local_1c;
  bool rc;
  ON_4fColor *pOStack_18;
  float f;
  ON_4fColor *color_local;
  ON_BinaryArchive *this_local;
  
  local_1c = 0.0;
  pOStack_18 = color;
  color_local = (ON_4fColor *)this;
  local_1d = ReadFloat(this,&local_1c);
  if (local_1d) {
    ON_4fColor::SetRed(pOStack_18,local_1c);
    local_1d = ReadFloat(this,&local_1c);
  }
  if (local_1d != false) {
    ON_4fColor::SetGreen(pOStack_18,local_1c);
    local_1d = ReadFloat(this,&local_1c);
  }
  if (local_1d != false) {
    ON_4fColor::SetBlue(pOStack_18,local_1c);
    local_1d = ReadFloat(this,&local_1c);
  }
  if (local_1d != false) {
    ON_4fColor::SetAlpha(pOStack_18,local_1c);
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::ReadColor(ON_4fColor& color)
{
  float f = 0.f;

  bool rc = ReadFloat(&f);
  if (rc)
  {
    color.SetRed(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetGreen(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetBlue(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetAlpha(f);
  }
  return rc;
}